

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O3

char * afm_stream_read_string(AFM_Stream stream)

{
  FT_Byte FVar1;
  FT_Byte *pFVar2;
  FT_Int FVar3;
  FT_Byte *pFVar4;
  
  afm_stream_skip_spaces(stream);
  if (stream->status < 2) {
    pFVar2 = stream->cursor + -1;
    FVar3 = 3;
    pFVar4 = stream->cursor;
    do {
      if (stream->limit <= pFVar4) goto LAB_0022f715;
      stream->cursor = pFVar4 + 1;
      FVar1 = *pFVar4;
      if (FVar1 == '\n') break;
      if (FVar1 == '\x1a') goto LAB_0022f715;
      pFVar4 = pFVar4 + 1;
    } while (FVar1 != '\r');
    FVar3 = 2;
LAB_0022f715:
    stream->status = FVar3;
  }
  else {
    pFVar2 = (FT_Byte *)0x0;
  }
  return (char *)pFVar2;
}

Assistant:

static char*
  afm_stream_read_string( AFM_Stream  stream )
  {
    char*  str;


    afm_stream_skip_spaces( stream );
    if ( AFM_STATUS_EOL( stream ) )
      return NULL;

    str = AFM_STREAM_KEY_BEGIN( stream );

    /* scan to eol */
    while ( 1 )
    {
      int  ch = AFM_GETC();


      if ( AFM_IS_NEWLINE( ch ) )
      {
        stream->status = AFM_STREAM_STATUS_EOL;
        break;
      }
      else if ( AFM_IS_EOF( ch ) )
      {
        stream->status = AFM_STREAM_STATUS_EOF;
        break;
      }
    }

    return str;
  }